

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O2

void __thiscall
duckdb::SortedAggregateState::FlushLinkedLists
          (SortedAggregateState *this,SortedAggregateBindData *order_bind)

{
  type pDVar1;
  
  InitializeChunks(this,order_bind);
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                     (&this->sort_chunk);
  FlushLinkedList(&order_bind->sort_funcs,&this->sort_linked,pDVar1);
  if ((this->arg_chunk).super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
      ._M_t.super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl != (DataChunk *)0x0) {
    pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                       (&this->arg_chunk);
    FlushLinkedList(&order_bind->arg_funcs,&this->arg_linked,pDVar1);
    return;
  }
  return;
}

Assistant:

void FlushLinkedLists(const SortedAggregateBindData &order_bind) {
		InitializeChunks(order_bind);
		FlushLinkedList(order_bind.sort_funcs, sort_linked, *sort_chunk);
		if (arg_chunk) {
			FlushLinkedList(order_bind.arg_funcs, arg_linked, *arg_chunk);
		}
	}